

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

uint __thiscall crnlib::dxt_image::get_selector(dxt_image *this,uint x,uint y,uint element_index)

{
  etc1_block *this_00;
  dxt3_block *block3;
  dxt5_block *block5;
  dxt1_block *block1;
  etc1_block *src_block;
  element *block;
  uint block_y;
  uint block_x;
  uint element_index_local;
  uint y_local;
  uint x_local;
  dxt_image *this_local;
  
  this_00 = (etc1_block *)get_element(this,x >> 2,y >> 2,element_index);
  switch(this->m_element_type[element_index]) {
  case cColorDXT1:
    this_local._4_4_ = dxt1_block::get_selector((dxt1_block *)this_00,x & 3,y & 3);
    break;
  case cAlphaDXT3:
    this_local._4_4_ = dxt3_block::get_alpha((dxt3_block *)this_00,x & 3,y & 3,false);
    break;
  case cAlphaDXT5:
    this_local._4_4_ = dxt5_block::get_selector((dxt5_block *)this_00,x & 3,y & 3);
    break;
  case cColorETC1:
    this_local._4_4_ = etc1_block::get_selector(this_00,x & 3,y & 3);
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint dxt_image::get_selector(uint x, uint y, uint element_index) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element& block = get_element(block_x, block_y, element_index);

        switch (m_element_type[element_index])
        {
        case cColorETC1:
        {
            const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
            return src_block.get_selector(x & 3, y & 3);
        }
        case cColorDXT1:
        {
            const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);
            return block1.get_selector(x & 3, y & 3);
        }
        case cAlphaDXT5:
        {
            const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);
            return block5.get_selector(x & 3, y & 3);
        }
        case cAlphaDXT3:
        {
            const dxt3_block& block3 = *reinterpret_cast<const dxt3_block*>(&block);
            return block3.get_alpha(x & 3, y & 3, false);
        }
        default:
            break;
        }

        return 0;
    }